

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O2

btDbvtNode * topdown(btDbvt *pdbvt,tNodeArray *leaves,int bu_treshold)

{
  int *piVar1;
  btAlignedObjectArray<btDbvtNode_*> *this;
  int iVar2;
  int iVar3;
  long lVar4;
  btDbvtNode *pbVar5;
  btDbvtNode *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  btAlignedObjectArray<btDbvtNode_*> *this_00;
  int i;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar12;
  undefined4 uVar13;
  btVector3 bVar14;
  int splitcount [3] [2];
  undefined8 uStack_d0;
  tNodeArray sets [2];
  btDbvtNode *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  btDbvtVolume vol;
  
  if ((topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis == '\0') &&
     (iVar3 = __cxa_guard_acquire(&topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis),
     iVar3 != 0)) {
    topdown::axis[0].m_floats[0] = 1.0;
    topdown::axis[0].m_floats[1] = 0.0;
    topdown::axis[0].m_floats[2] = 0.0;
    topdown::axis[0].m_floats[3] = 0.0;
    topdown::axis[1].m_floats[0] = 0.0;
    topdown::axis[1].m_floats[1] = 1.0;
    topdown::axis[1].m_floats[2] = 0.0;
    topdown::axis[1].m_floats[3] = 0.0;
    topdown::axis[2].m_floats[0] = 0.0;
    topdown::axis[2].m_floats[1] = 0.0;
    topdown::axis[2].m_floats[2] = 1.0;
    topdown::axis[2].m_floats[3] = 0.0;
    __cxa_guard_release(&topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis);
  }
  iVar3 = leaves->m_size;
  if (1 < (long)iVar3) {
    if (bu_treshold < iVar3) {
      pbVar5 = *leaves->m_data;
      sets[0]._0_4_ = (pbVar5->volume).mi.m_floats[0];
      sets[0].m_size = (int)(pbVar5->volume).mi.m_floats[1];
      sets[0].m_capacity = (int)(pbVar5->volume).mi.m_floats[2];
      sets[0]._12_4_ = (pbVar5->volume).mi.m_floats[3];
      sets[0].m_data = *(btDbvtNode ***)(pbVar5->volume).mx.m_floats;
      sets[0]._24_8_ = *(undefined8 *)((pbVar5->volume).mx.m_floats + 2);
      for (lVar11 = 1; iVar3 != lVar11; lVar11 = lVar11 + 1) {
        Merge((btDbvtAabbMm *)sets,&leaves->m_data[lVar11]->volume,(btDbvtAabbMm *)sets);
      }
      vol.mx.m_floats[0] = sets[0].m_data._0_4_;
      vol.mx.m_floats[1] = sets[0].m_data._4_4_;
      vol.mx.m_floats[2] = (btScalar)sets[0]._24_4_;
      vol.mx.m_floats[3] = (btScalar)sets[0]._28_4_;
      vol.mi.m_floats[0] = (btScalar)sets[0]._0_4_;
      vol.mi.m_floats[1] = (btScalar)sets[0].m_size;
      vol.mi.m_floats[2] = (btScalar)sets[0].m_capacity;
      vol.mi.m_floats[3] = (btScalar)sets[0]._12_4_;
      uVar12 = sets[0]._24_4_;
      uVar13 = sets[0]._28_4_;
      bVar14 = btDbvtAabbMm::Center(&vol);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = bVar14.m_floats._0_8_;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_78._8_4_ = uVar12;
      local_78._0_8_ = bVar14.m_floats._8_8_;
      local_78._12_4_ = uVar13;
      lVar11 = 0x18;
      do {
        (&sets[0].field_0x0)[lVar11] = 1;
        *(undefined8 *)((long)&uStack_d0 + lVar11) = 0;
        *(undefined8 *)((long)splitcount[1] + lVar11 + 4) = 0;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x58);
      iVar3 = leaves->m_size;
      splitcount[0][0] = 0;
      splitcount[0][1] = 0;
      splitcount[1][0] = 0;
      splitcount[1][1] = 0;
      splitcount[2][0] = 0;
      splitcount[2][1] = 0;
      iVar2 = iVar3;
      for (lVar11 = 0; lVar11 < iVar2; lVar11 = lVar11 + 1) {
        bVar14 = btDbvtAabbMm::Center(&leaves->m_data[lVar11]->volume);
        for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
          piVar1 = (int *)((long)splitcount[0] +
                          lVar4 + (ulong)(0.0 < *(float *)((long)topdown::axis[0].m_floats +
                                                          lVar4 * 2 + 8) *
                                                (bVar14.m_floats[2] - (float)local_78._0_4_) +
                                                *(float *)((long)topdown::axis[0].m_floats +
                                                          lVar4 * 2) *
                                                (bVar14.m_floats[0] - (float)local_68._0_4_) +
                                                *(float *)((long)topdown::axis[0].m_floats +
                                                          lVar4 * 2 + 4) *
                                                (bVar14.m_floats[1] - (float)local_68._4_4_)) * 4);
          *piVar1 = *piVar1 + 1;
        }
        iVar2 = leaves->m_size;
      }
      uVar7 = 0xffffffffffffffff;
      for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
        if ((0 < splitcount[uVar8][0]) && (0 < splitcount[uVar8][1])) {
          iVar10 = (int)ABS((float)(splitcount[uVar8][0] - splitcount[uVar8][1]));
          if (iVar10 < iVar3) {
            uVar7 = uVar8;
          }
          uVar7 = uVar7 & 0xffffffff;
          if (iVar10 <= iVar3) {
            iVar3 = iVar10;
          }
        }
      }
      if ((int)uVar7 < 0) {
        btAlignedObjectArray<btDbvtNode_*>::reserve(sets,iVar2 / 2 + 1);
        btAlignedObjectArray<btDbvtNode_*>::reserve(sets + 1,leaves->m_size / 2);
        uVar8 = 0;
        uVar7 = (ulong)(uint)leaves->m_size;
        if (leaves->m_size < 1) {
          uVar7 = uVar8;
        }
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          btAlignedObjectArray<btDbvtNode_*>::push_back
                    ((btAlignedObjectArray<btDbvtNode_*> *)
                     (&sets[0].field_0x0 + (((uint)uVar9 & 1) << 5)),
                     (btDbvtNode **)((long)leaves->m_data + uVar8));
          uVar8 = uVar8 + 8;
        }
      }
      else {
        uVar7 = uVar7 & 0xffffffff;
        btAlignedObjectArray<btDbvtNode_*>::reserve(sets,splitcount[uVar7][0]);
        this = sets + 1;
        btAlignedObjectArray<btDbvtNode_*>::reserve(this,splitcount[uVar7][1]);
        local_80 = (btDbvtNode *)0x0;
        btAlignedObjectArray<btDbvtNode_*>::resize(sets,0,&local_80);
        local_80 = (btDbvtNode *)0x0;
        uVar9 = 0;
        btAlignedObjectArray<btDbvtNode_*>::resize(this,0,&local_80);
        uVar8 = (ulong)(uint)leaves->m_size;
        if (leaves->m_size < 1) {
          uVar8 = uVar9;
        }
        for (; uVar8 * 8 != uVar9; uVar9 = uVar9 + 8) {
          bVar14 = btDbvtAabbMm::Center(*(btDbvtAabbMm **)((long)leaves->m_data + uVar9));
          this_00 = sets;
          if (0.0 <= (bVar14.m_floats[2] - (float)local_78._0_4_) * topdown::axis[uVar7].m_floats[2]
                     + topdown::axis[uVar7].m_floats[0] *
                       (bVar14.m_floats[0] - (float)local_68._0_4_) +
                       (bVar14.m_floats[1] - (float)local_68._4_4_) *
                       topdown::axis[uVar7].m_floats[1]) {
            this_00 = this;
          }
          btAlignedObjectArray<btDbvtNode_*>::push_back
                    (this_00,(btDbvtNode **)((long)leaves->m_data + uVar9));
        }
      }
      pbVar5 = createnode(pdbvt,(btDbvtNode *)0x0,(void *)0x0);
      *(ulong *)(pbVar5->volume).mx.m_floats = CONCAT44(vol.mx.m_floats[1],vol.mx.m_floats[0]);
      *(ulong *)((pbVar5->volume).mx.m_floats + 2) = CONCAT44(vol.mx.m_floats[3],vol.mx.m_floats[2])
      ;
      *(undefined8 *)(pbVar5->volume).mi.m_floats = vol.mi.m_floats._0_8_;
      *(undefined8 *)((pbVar5->volume).mi.m_floats + 2) = vol.mi.m_floats._8_8_;
      pbVar6 = topdown(pdbvt,sets,bu_treshold);
      (pbVar5->field_2).childs[0] = pbVar6;
      pbVar6 = topdown(pdbvt,sets + 1,bu_treshold);
      (pbVar5->field_2).childs[1] = pbVar6;
      (pbVar5->field_2).childs[0]->parent = pbVar5;
      (pbVar5->field_2).childs[1]->parent = pbVar5;
      lVar11 = 0x20;
      do {
        btAlignedObjectArray<btDbvtNode_*>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btDbvtNode_*> *)(&sets[0].field_0x0 + lVar11));
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x20);
      return pbVar5;
    }
    bottomup(pdbvt,leaves);
  }
  return *leaves->m_data;
}

Assistant:

static btDbvtNode*			topdown(btDbvt* pdbvt,
									tNodeArray& leaves,
									int bu_treshold)
{
	static const btVector3	axis[]={btVector3(1,0,0),
		btVector3(0,1,0),
		btVector3(0,0,1)};
	if(leaves.size()>1)
	{
		if(leaves.size()>bu_treshold)
		{
			const btDbvtVolume	vol=bounds(leaves);
			const btVector3			org=vol.Center();
			tNodeArray				sets[2];
			int						bestaxis=-1;
			int						bestmidp=leaves.size();
			int						splitcount[3][2]={{0,0},{0,0},{0,0}};
			int i;
			for( i=0;i<leaves.size();++i)
			{
				const btVector3	x=leaves[i]->volume.Center()-org;
				for(int j=0;j<3;++j)
				{
					++splitcount[j][btDot(x,axis[j])>0?1:0];
				}
			}
			for( i=0;i<3;++i)
			{
				if((splitcount[i][0]>0)&&(splitcount[i][1]>0))
				{
					const int	midp=(int)btFabs(btScalar(splitcount[i][0]-splitcount[i][1]));
					if(midp<bestmidp)
					{
						bestaxis=i;
						bestmidp=midp;
					}
				}
			}
			if(bestaxis>=0)
			{
				sets[0].reserve(splitcount[bestaxis][0]);
				sets[1].reserve(splitcount[bestaxis][1]);
				split(leaves,sets[0],sets[1],org,axis[bestaxis]);
			}
			else
			{
				sets[0].reserve(leaves.size()/2+1);
				sets[1].reserve(leaves.size()/2);
				for(int i=0,ni=leaves.size();i<ni;++i)
				{
					sets[i&1].push_back(leaves[i]);
				}
			}
			btDbvtNode*	node=createnode(pdbvt,0,vol,0);
			node->childs[0]=topdown(pdbvt,sets[0],bu_treshold);
			node->childs[1]=topdown(pdbvt,sets[1],bu_treshold);
			node->childs[0]->parent=node;
			node->childs[1]->parent=node;
			return(node);
		}
		else
		{
			bottomup(pdbvt,leaves);
			return(leaves[0]);
		}
	}
	return(leaves[0]);
}